

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen_code.c
# Opt level: O2

void printGroupSize(char *groupName,uint index,uint isFirst,uint isLast)

{
  char *pcVar1;
  
  pcVar1 = "";
  if (isLast == 0) {
    pcVar1 = ",";
  }
  fprintf((FILE *)gOutGroupIdx_C->file,"SIZE_GROUP_%d%s\n",index,pcVar1);
  return;
}

Assistant:

static void printGroupSize( const char *groupName,
                            unsigned int index,
                            unsigned int isFirst,
                            unsigned int isLast
                           )
{
   (void)isFirst;   /* Get ride of compiler warning. */
   (void)groupName; /* Get ride of compiler warning. */

   #if defined(ENABLE_C)
      fprintf( gOutGroupIdx_C->file, "SIZE_GROUP_%d%s\n",
               index, isLast? "" : "," );
   #endif
}